

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadEffectProfileCommon(ColladaParser *this,Effect *pEffect)

{
  ImageLibrary *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar5;
  char *__s1;
  aiColor4D dummy;
  string id;
  undefined1 local_138 [8];
  _Alloc_hider _Stack_130;
  undefined1 local_128 [24];
  pointer puStack_110;
  pointer local_108;
  _Alloc_hider _Stack_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  Sampler *local_e0;
  ai_real *local_d8;
  ai_real *local_d0;
  ai_real *local_c8;
  ai_real *local_c0;
  Sampler *local_b8;
  aiColor4D *local_b0;
  Sampler *local_a8;
  aiColor4D *local_a0;
  Sampler *local_98;
  aiColor4D *local_90;
  Sampler *local_88;
  aiColor4D *local_80;
  Sampler *local_78;
  aiColor4D *local_70;
  Sampler *local_68;
  aiColor4D *local_60;
  ImageLibrary *local_58;
  key_type local_50;
  undefined4 extraout_var_02;
  
  local_e0 = &pEffect->mTexBump;
  local_d8 = &pEffect->mRefractIndex;
  local_d0 = &pEffect->mTransparency;
  local_c8 = &pEffect->mReflectivity;
  local_c0 = &pEffect->mShininess;
  local_b0 = &pEffect->mTransparent;
  local_b8 = &pEffect->mTexTransparent;
  local_a0 = &pEffect->mReflective;
  local_a8 = &pEffect->mTexReflective;
  local_90 = &pEffect->mSpecular;
  local_98 = &pEffect->mTexSpecular;
  local_80 = &pEffect->mDiffuse;
  local_88 = &pEffect->mTexDiffuse;
  local_70 = &pEffect->mAmbient;
  local_78 = &pEffect->mTexAmbient;
  local_60 = &pEffect->mEmissive;
  local_68 = &pEffect->mTexEmissive;
  local_58 = &this->mImageLibrary;
  do {
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"newparam");
        if (bVar1) {
          uVar3 = GetAttribute(this,"sid");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar2),
                     (allocator<char> *)local_138);
          local_128._16_8_ = 0;
          local_138 = (undefined1  [8])0x0;
          local_128._0_8_ = 0;
          local_128._8_8_ = 0;
          _Stack_130._M_p = local_128 + 8;
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
                   ::operator[](&pEffect->mParams,&local_50);
          Collada::EffectParam::operator=(pmVar4,(EffectParam *)local_138);
          std::__cxx11::string::~string((string *)&_Stack_130);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
                   ::operator[](&pEffect->mParams,&local_50);
          ReadEffectParam(this,pmVar4);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          bVar1 = IsElement(this,"technique");
          if ((!bVar1) && (bVar1 = IsElement(this,"extra"), !bVar1)) {
            if ((this->mFormat == FV_1_4_n) && (bVar1 = IsElement(this,"image"), bVar1)) {
              uVar3 = GetAttribute(this,"id");
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,(char *)CONCAT44(extraout_var_01,iVar2),
                         (allocator<char> *)local_138);
              this_00 = local_58;
              local_138 = (undefined1  [8])local_128;
              local_f8 = 0;
              local_128._0_8_ = 0;
              local_128._8_8_ = 0;
              aStack_f0._8_8_ = 0;
              _Stack_130._M_p = (pointer)0x0;
              local_108 = (pointer)0x0;
              local_128._16_8_ = 0;
              puStack_110 = (pointer)0x0;
              _Stack_100._M_p = (pointer)&aStack_f0;
              aStack_f0._M_allocated_capacity = 0;
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                       ::operator[](local_58,&local_50);
              Collada::Image::operator=(pmVar5,(Image *)local_138);
              Collada::Image::~Image((Image *)local_138);
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                       ::operator[](this_00,&local_50);
              ReadImage(this,pmVar5);
              std::__cxx11::string::~string((string *)&local_50);
            }
            else {
              bVar1 = IsElement(this,"phong");
              if (bVar1) {
                pEffect->mShadeType = Shade_Phong;
              }
              else {
                bVar1 = IsElement(this,"constant");
                if (bVar1) {
                  pEffect->mShadeType = Shade_Constant;
                }
                else {
                  bVar1 = IsElement(this,"lambert");
                  if (bVar1) {
                    pEffect->mShadeType = Shade_Lambert;
                  }
                  else {
                    bVar1 = IsElement(this,"blinn");
                    if (bVar1) {
                      pEffect->mShadeType = Shade_Blinn;
                    }
                    else {
                      bVar1 = IsElement(this,"emission");
                      if (bVar1) {
                        ReadEffectColor(this,local_60,local_68);
                      }
                      else {
                        bVar1 = IsElement(this,"ambient");
                        if (bVar1) {
                          ReadEffectColor(this,local_70,local_78);
                        }
                        else {
                          bVar1 = IsElement(this,"diffuse");
                          if (bVar1) {
                            ReadEffectColor(this,local_80,local_88);
                          }
                          else {
                            bVar1 = IsElement(this,"specular");
                            if (bVar1) {
                              ReadEffectColor(this,local_90,local_98);
                            }
                            else {
                              bVar1 = IsElement(this,"reflective");
                              if (bVar1) {
                                ReadEffectColor(this,local_a0,local_a8);
                              }
                              else {
                                bVar1 = IsElement(this,"transparent");
                                if (bVar1) {
                                  pEffect->mHasTransparency = true;
                                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[8])
                                                    (this->mReader,"opaque");
                                  __s1 = (char *)CONCAT44(extraout_var_02,iVar2);
                                  iVar2 = strcmp(__s1,"RGB_ZERO");
                                  if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"RGB_ONE"), iVar2 == 0))
                                  {
                                    pEffect->mRGBTransparency = true;
                                  }
                                  iVar2 = strcmp(__s1,"RGB_ZERO");
                                  if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"A_ZERO"), iVar2 == 0)) {
                                    pEffect->mInvertTransparency = true;
                                  }
                                  ReadEffectColor(this,local_b0,local_b8);
                                }
                                else {
                                  bVar1 = IsElement(this,"shininess");
                                  if (bVar1) {
                                    ReadEffectFloat(this,local_c0);
                                  }
                                  else {
                                    bVar1 = IsElement(this,"reflectivity");
                                    if (bVar1) {
                                      ReadEffectFloat(this,local_c8);
                                    }
                                    else {
                                      bVar1 = IsElement(this,"transparency");
                                      if (bVar1) {
                                        ReadEffectFloat(this,local_d0);
                                      }
                                      else {
                                        bVar1 = IsElement(this,"index_of_refraction");
                                        if (bVar1) {
                                          ReadEffectFloat(this,local_d8);
                                        }
                                        else {
                                          bVar1 = IsElement(this,"double_sided");
                                          if (bVar1) {
                                            bVar1 = ReadBoolFromTextContent(this);
                                            pEffect->mDoubleSided = bVar1;
                                          }
                                          else {
                                            bVar1 = IsElement(this,"bump");
                                            if (bVar1) {
                                              local_138 = (undefined1  [8])0x0;
                                              _Stack_130._M_p = (pointer)0x0;
                                              ReadEffectColor(this,(aiColor4D *)local_138,local_e0);
                                            }
                                            else {
                                              bVar1 = IsElement(this,"wireframe");
                                              if (bVar1) {
                                                bVar1 = ReadBoolFromTextContent(this);
                                                pEffect->mWireframe = bVar1;
                                                TestClosing(this,"wireframe");
                                              }
                                              else {
                                                bVar1 = IsElement(this,"faceted");
                                                if (bVar1) {
                                                  bVar1 = ReadBoolFromTextContent(this);
                                                  pEffect->mFaceted = bVar1;
                                                  TestClosing(this,"faceted");
                                                }
                                                else {
                                                  SkipElement(this);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"profile_COMMON");
  } while (iVar2 != 0);
  return;
}

Assistant:

void ColladaParser::ReadEffectProfileCommon(Collada::Effect& pEffect)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("newparam")) {
                // save ID
                int attrSID = GetAttribute("sid");
                std::string sid = mReader->getAttributeValue(attrSID);
                pEffect.mParams[sid] = EffectParam();
                ReadEffectParam(pEffect.mParams[sid]);
            }
            else if (IsElement("technique") || IsElement("extra"))
            {
                // just syntactic sugar
            }

            else if (mFormat == FV_1_4_n && IsElement("image"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mImageLibrary[id] = Image();

                // read on from there
                ReadImage(mImageLibrary[id]);
            }

            /* Shading modes */
            else if (IsElement("phong"))
                pEffect.mShadeType = Shade_Phong;
            else if (IsElement("constant"))
                pEffect.mShadeType = Shade_Constant;
            else if (IsElement("lambert"))
                pEffect.mShadeType = Shade_Lambert;
            else if (IsElement("blinn"))
                pEffect.mShadeType = Shade_Blinn;

            /* Color + texture properties */
            else if (IsElement("emission"))
                ReadEffectColor(pEffect.mEmissive, pEffect.mTexEmissive);
            else if (IsElement("ambient"))
                ReadEffectColor(pEffect.mAmbient, pEffect.mTexAmbient);
            else if (IsElement("diffuse"))
                ReadEffectColor(pEffect.mDiffuse, pEffect.mTexDiffuse);
            else if (IsElement("specular"))
                ReadEffectColor(pEffect.mSpecular, pEffect.mTexSpecular);
            else if (IsElement("reflective")) {
                ReadEffectColor(pEffect.mReflective, pEffect.mTexReflective);
            }
            else if (IsElement("transparent")) {
                pEffect.mHasTransparency = true;

                const char* opaque = mReader->getAttributeValueSafe("opaque");

                if (::strcmp(opaque, "RGB_ZERO") == 0 || ::strcmp(opaque, "RGB_ONE") == 0) {
                    pEffect.mRGBTransparency = true;
                }

                // In RGB_ZERO mode, the transparency is interpreted in reverse, go figure...
                if (::strcmp(opaque, "RGB_ZERO") == 0 || ::strcmp(opaque, "A_ZERO") == 0) {
                    pEffect.mInvertTransparency = true;
                }

                ReadEffectColor(pEffect.mTransparent, pEffect.mTexTransparent);
            }
            else if (IsElement("shininess"))
                ReadEffectFloat(pEffect.mShininess);
            else if (IsElement("reflectivity"))
                ReadEffectFloat(pEffect.mReflectivity);

            /* Single scalar properties */
            else if (IsElement("transparency"))
                ReadEffectFloat(pEffect.mTransparency);
            else if (IsElement("index_of_refraction"))
                ReadEffectFloat(pEffect.mRefractIndex);

            // GOOGLEEARTH/OKINO extensions
            // -------------------------------------------------------
            else if (IsElement("double_sided"))
                pEffect.mDoubleSided = ReadBoolFromTextContent();

            // FCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("bump")) {
                aiColor4D dummy;
                ReadEffectColor(dummy, pEffect.mTexBump);
            }

            // MAX3D extensions
            // -------------------------------------------------------
            else if (IsElement("wireframe")) {
                pEffect.mWireframe = ReadBoolFromTextContent();
                TestClosing("wireframe");
            }
            else if (IsElement("faceted")) {
                pEffect.mFaceted = ReadBoolFromTextContent();
                TestClosing("faceted");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "profile_COMMON") == 0)
            {
                break;
            }
        }
    }
}